

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::
     AddArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
               (AggregateFunctionSet *fun,LogicalType *type)

{
  bool bVar1;
  AggregateFunction *in_RDI;
  LogicalType *by_type;
  iterator __end2;
  iterator __begin2;
  vector<duckdb::LogicalType,_true> *__range2;
  vector<duckdb::LogicalType,_true> by_types;
  AggregateFunction *in_stack_fffffffffffffe68;
  AggregateFunction *in_stack_fffffffffffffe70;
  LogicalType *in_stack_fffffffffffffec0;
  LogicalType *in_stack_fffffffffffffec8;
  __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_38;
  undefined1 *local_30;
  undefined1 local_28 [32];
  AggregateFunction *local_8;
  
  local_8 = in_RDI;
  ArgMaxByTypes();
  local_30 = local_28;
  local_38._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffe68);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             in_stack_fffffffffffffe68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)in_stack_fffffffffffffe70,
                       (__normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                        *)in_stack_fffffffffffffe68);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator*(&local_38);
    in_stack_fffffffffffffe70 = local_8;
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,duckdb::timestamp_t>
              (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    FunctionSet<duckdb::AggregateFunction>::AddFunction
              ((FunctionSet<duckdb::AggregateFunction> *)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    AggregateFunction::~AggregateFunction(in_stack_fffffffffffffe70);
    __gnu_cxx::
    __normal_iterator<duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(&local_38);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x8be83e);
  return;
}

Assistant:

void AddArgMinMaxFunctionBy(AggregateFunctionSet &fun, const LogicalType &type) {
	auto by_types = ArgMaxByTypes();
	for (const auto &by_type : by_types) {
#ifndef DUCKDB_SMALLER_BINARY
		fun.AddFunction(GetArgMinMaxFunctionBy<OP, ARG_TYPE>(by_type, type));
#else
		fun.AddFunction(GetArgMinMaxFunctionInternal<OP, string_t, string_t>(by_type, type));
#endif
	}
}